

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::~Federate(Federate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  PotentialInterfacesManager *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->_vptr_Federate = (_func_int **)&PTR__Federate_0055fe70;
  if ((this->currentMode)._M_i != FINALIZE) {
    finalize(this);
  }
  p_Var2 = (this->errorHandlerCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->errorHandlerCallback,(_Any_data *)&this->errorHandlerCallback,
              __destroy_functor);
  }
  p_Var2 = (this->cosimulationTerminationCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->cosimulationTerminationCallback,
              (_Any_data *)&this->cosimulationTerminationCallback,__destroy_functor);
  }
  p_Var2 = (this->executingEntryCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->executingEntryCallback,(_Any_data *)&this->executingEntryCallback,
              __destroy_functor);
  }
  p_Var2 = (this->initializingEntryCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->initializingEntryCallback,
              (_Any_data *)&this->initializingEntryCallback,__destroy_functor);
  }
  p_Var2 = (this->timeRequestReturnCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->timeRequestReturnCallback,
              (_Any_data *)&this->timeRequestReturnCallback,__destroy_functor);
  }
  p_Var2 = (this->modeUpdateCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->modeUpdateCallback,(_Any_data *)&this->modeUpdateCallback,
              __destroy_functor);
  }
  p_Var2 = (this->timeUpdateCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->timeUpdateCallback,(_Any_data *)&this->timeUpdateCallback,
              __destroy_functor);
  }
  p_Var2 = (this->timeRequestEntryCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->timeRequestEntryCallback,
              (_Any_data *)&this->timeRequestEntryCallback,__destroy_functor);
  }
  pcVar3 = (this->mName)._M_dataplus._M_p;
  paVar1 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  __ptr = (this->potManager)._M_t.
          super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
          .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
  if (__ptr != (PotentialInterfacesManager *)0x0) {
    std::default_delete<helics::PotentialInterfacesManager>::operator()
              ((default_delete<helics::PotentialInterfacesManager> *)&this->potManager,__ptr);
  }
  (this->potManager)._M_t.
  super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
  .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl =
       (PotentialInterfacesManager *)0x0;
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::~unique_ptr(&this->cManager);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::~unique_ptr(&this->asyncCallInfo);
  pcVar3 = (this->configFile)._M_dataplus._M_p;
  paVar1 = &(this->configFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

Federate::~Federate()
{
    if (currentMode != Modes::FINALIZE) {
        try {
            finalize();
        }
        // LCOV_EXCL_START
        catch (...)  // do not allow a throw inside the destructor
        {
            // finalize may throw but we can't allow that
            ;
        }
        // LCOV_EXCL_STOP
    }
}